

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkState.cpp
# Opt level: O2

void __thiscall xmrig::NetworkState::stop(NetworkState *this)

{
  pointer puVar1;
  
  this->m_active = false;
  this->diff = 0;
  String::operator=(&this->m_ip,(nullptr_t)0x0);
  String::operator=(&this->m_tls,(nullptr_t)0x0);
  String::operator=(&this->m_fingerprint,(nullptr_t)0x0);
  this->failures = this->failures + 1;
  puVar1 = (this->m_latency).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_latency).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_latency).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  return;
}

Assistant:

void xmrig::NetworkState::stop()
{
    m_active      = false;
    diff          = 0;
    m_ip          = nullptr;
    m_tls         = nullptr;
    m_fingerprint = nullptr;

    failures++;
    m_latency.clear();
}